

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Init
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  Arena *this_00;
  InnerMap *pIVar1;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    pIVar1 = (InnerMap *)operator_new(0x30);
    InnerMap::InnerMap(pIVar1,0,0);
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (this_00,(type_info *)
                         &Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
                          typeinfo,0x30);
    }
    pIVar1 = (InnerMap *)
             internal::ArenaImpl::AllocateAlignedAndAddCleanup
                       (&this_00->impl_,0x30,
                        internal::
                        arena_destruct_object<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap>
                       );
    InnerMap::InnerMap(pIVar1,0,this_00);
  }
  this->elements_ = pIVar1;
  return;
}

Assistant:

void Init() {
    elements_ =
        Arena::Create<InnerMap>(arena_, 0u, hasher(), Allocator(arena_));
  }